

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadpool.cpp
# Opt level: O2

void __thiscall QThreadPool::startOnReservedThread(QThreadPool *this,QRunnable *runnable)

{
  QThreadPoolPrivate *this_00;
  bool bVar1;
  long in_FS_OFFSET;
  undefined1 local_28 [16];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (runnable == (QRunnable *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      releaseThread(this);
      return;
    }
  }
  else {
    this_00 = (QThreadPoolPrivate *)(this->super_QObject).d_ptr.d;
    local_28._0_8_ = &this_00->mutex;
    local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QBasicMutex::lock((QBasicMutex *)local_28._0_8_);
    local_28[8] = true;
    this_00->reservedThreads = this_00->reservedThreads + -1;
    bVar1 = QThreadPoolPrivate::tryStart(this_00,runnable);
    if (!bVar1) {
      QThreadPoolPrivate::enqueueTask(this_00,runnable,0x7fffffff);
    }
    QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_28);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QThreadPool::startOnReservedThread(QRunnable *runnable)
{
    if (!runnable)
        return releaseThread();

    Q_D(QThreadPool);
    QMutexLocker locker(&d->mutex);
    Q_ASSERT(d->reservedThreads > 0);
    --d->reservedThreads;

    if (!d->tryStart(runnable)) {
        // This can only happen if we reserved max threads,
        // and something took the one minimum thread.
        d->enqueueTask(runnable, INT_MAX);
    }
}